

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O3

string * __thiscall
ninx::lexer::Reader::read_identifier_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,int *trailing_spaces,int target_suffix,
          bool *found)

{
  pointer *ppcVar1;
  char *pcVar2;
  istream iVar3;
  pointer pcVar4;
  iterator iVar5;
  bool *pbVar6;
  int *piVar7;
  char cVar8;
  allocator aVar9;
  int iVar10;
  int iVar11;
  LexerException *this_00;
  long lVar12;
  bool bVar13;
  char current;
  allocator local_6d;
  int local_6c;
  bool *local_68;
  int *local_60;
  vector<char,std::allocator<char>> *local_58;
  string local_50;
  
  pcVar4 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar4) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar4;
  }
  local_58 = (vector<char,std::allocator<char>> *)&this->buffer;
  iVar3 = this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20];
  local_60 = trailing_spaces;
  local_6c = target_suffix;
  local_68 = found;
  while (((byte)iVar3 & 5) == 0) {
    cVar8 = std::istream::peek();
    iVar11 = isspace((int)cVar8);
    if (iVar11 != 0) break;
    lVar12 = 0;
    do {
      pcVar2 = &LIMITER_CHARS + lVar12;
      if (*pcVar2 == cVar8) break;
      bVar13 = lVar12 != 0x11;
      lVar12 = lVar12 + 1;
    } while (bVar13);
    if ((cVar8 != '_' && *pcVar2 == cVar8) ||
       (aVar9 = (allocator)std::istream::get(), local_6d = aVar9, aVar9 == (allocator)0xff)) break;
    iVar11 = isalpha((int)(char)aVar9);
    if (((int)(char)aVar9 - 0x3aU < 0xfffffff6 && iVar11 == 0) &&
       ((aVar9 != (allocator)0x2e && (aVar9 != (allocator)0x5f)))) {
      this_00 = (LexerException *)__cxa_allocate_exception(0x20);
      iVar11 = this->line_number;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Identifier can only contain alphanumeric characters.","");
      exception::LexerException::LexerException(this_00,iVar11,&this->origin,&local_50);
      __cxa_throw(this_00,&exception::LexerException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar5._M_current =
         (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                (local_58,iVar5,(char *)&local_6d);
    }
    else {
      *iVar5._M_current = (char)aVar9;
      ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    iVar3 = this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20];
  }
  local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
  iVar5._M_current =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              ((vector<char,_std::allocator<char>_> *)local_58,iVar5,(char *)&local_50);
  }
  else {
    *iVar5._M_current = '\0';
    ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  piVar7 = local_60;
  pbVar6 = local_68;
  iVar11 = local_6c;
  *local_68 = false;
  if ((local_6c != -1) && (iVar10 = std::istream::peek(), iVar10 == iVar11)) {
    std::istream::get();
    *pbVar6 = true;
  }
  iVar11 = ignore_spaces(this);
  *piVar7 = iVar11;
  std::__cxx11::string::string
            ((string *)&local_50,
             (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_6d);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::Reader::read_identifier(int &trailing_spaces, int target_suffix, bool &found) {
    this->buffer.clear();

    while (stream) {
        // An identifier is valid until a space or a limiter is found
        char next_char = static_cast<char>(stream.peek());
        if (isspace(next_char) || (is_limiter(next_char) && next_char != '_')) {
            break;
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        // If the current char is not alphanumeric, underscore or dot ( used to call nested methods and variables ),
        // raise an exception
        if (isalpha(current) == 0 && isdigit(current) == 0 && current != '.' && current != '_') {
            throw LexerException(this->line_number, this->origin,
                                 "Identifier can only contain alphanumeric characters.");
        }

        this->buffer.push_back(current);
    }

    this->buffer.push_back(0);

    found = false;
    if (target_suffix != -1 && stream.peek() == target_suffix) {
        stream.get();
        found = true;
    }

    trailing_spaces = ignore_spaces();

    return std::move(std::string{buffer.data()});
}